

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

Id dxil_spv::build_naturally_extended_value(Impl *impl,Value *value,uint bits,bool is_signed)

{
  TypeID TVar1;
  uint width;
  uint uVar2;
  Op op;
  Id IVar3;
  Type *pTVar4;
  Builder *this;
  Operation *this_00;
  Operation *mask_op;
  Builder *builder;
  uint physical_bits;
  uint logical_bits;
  Id id;
  bool is_signed_local;
  uint bits_local;
  Value *value_local;
  Impl *impl_local;
  
  impl_local._4_4_ = Converter::Impl::get_id_for_value(impl,value,0);
  pTVar4 = LLVMBC::Value::getType(value);
  TVar1 = LLVMBC::Type::getTypeID(pTVar4);
  if (TVar1 == IntegerTyID) {
    pTVar4 = LLVMBC::Value::getType(value);
    width = LLVMBC::Type::getIntegerBitWidth(pTVar4);
    uVar2 = physical_integer_bit_width(width);
    id = bits;
    if (bits == 0) {
      id = width;
    }
    if (id != uVar2) {
      this = Converter::Impl::builder(impl);
      op = OpBitFieldUExtract;
      if (is_signed) {
        op = OpBitFieldSExtract;
      }
      pTVar4 = LLVMBC::Value::getType(value);
      IVar3 = Converter::Impl::get_type_id(impl,pTVar4,0);
      this_00 = Converter::Impl::allocate(impl,op,IVar3);
      Operation::add_id(this_00,impl_local._4_4_);
      IVar3 = spv::Builder::makeUintConstant(this,0,false);
      Operation::add_id(this_00,IVar3);
      IVar3 = spv::Builder::makeUintConstant(this,id,false);
      Operation::add_id(this_00,IVar3);
      Converter::Impl::add(impl,this_00,false);
      impl_local._4_4_ = this_00->id;
    }
  }
  return impl_local._4_4_;
}

Assistant:

static spv::Id build_naturally_extended_value(Converter::Impl &impl, const llvm::Value *value,
                                              unsigned bits, bool is_signed)
{
	spv::Id id = impl.get_id_for_value(value);
	if (value->getType()->getTypeID() != llvm::Type::TypeID::IntegerTyID)
		return id;

	auto logical_bits = value->getType()->getIntegerBitWidth();
	auto physical_bits = physical_integer_bit_width(logical_bits);

	if (bits == 0)
		bits = logical_bits;
	if (bits == physical_bits)
		return id;

	auto &builder = impl.builder();
	auto *mask_op = impl.allocate(is_signed ? spv::OpBitFieldSExtract : spv::OpBitFieldUExtract,
	                              impl.get_type_id(value->getType()));
	mask_op->add_id(id);
	mask_op->add_id(builder.makeUintConstant(0));
	mask_op->add_id(builder.makeUintConstant(bits));
	impl.add(mask_op);
	return mask_op->id;
}